

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

void amrex::MLLinOp::makeConsolidatedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm,
               int ratio,int strategy)

{
  pointer pDVar1;
  long *plVar2;
  int *piVar3;
  pointer piVar4;
  Vector<int,_std::allocator<int>_> *pVVar5;
  div_t dVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  int *x_1;
  pointer piVar10;
  ulong uVar11;
  double dVar12;
  Vector<int,_std::allocator<int>_> pmap;
  Vector<int,_std::allocator<int>_> pmap_g;
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  int local_68;
  int local_64;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *local_60;
  vector<int,_std::allocator<int>_> local_58;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_40;
  ulong local_38;
  
  uVar8 = (int)((long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3b13b13b;
  if (1 < (int)uVar8) {
    uVar9 = (ulong)(uVar8 & 0x7fffffff);
    local_68 = 1;
    uVar11 = 1;
    local_64 = strategy;
    local_60 = dm;
    local_40 = ba;
    local_38 = uVar9;
    do {
      pDVar1 = (dm->
               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ).
               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar2 = *(long **)&pDVar1[uVar11].m_ref.
                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ;
      if (*plVar2 == plVar2[1]) {
        uVar8 = *(uint *)(DAT_00816950 + -0x38);
        pVVar5 = DistributionMapping::ProcessorMap(pDVar1 + (uVar11 - 1));
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_80,
                   (long)(pVVar5->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pVVar5->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_58);
        ParallelContext::Frame::global_to_local_rank
                  ((Frame *)(DAT_00816950 + -0x48),
                   local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pVVar5->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,(long)(int)((ulong)((long)local_80.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_80.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
        local_68 = local_68 * ratio;
        if (strategy == 3) {
          piVar7 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_68 == ratio) {
            DistributionMapping::makeSFC
                      ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&local_58,
                       (local_40->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + uVar11,true,
                       *(int *)(DAT_00816950 + -0x38));
            if (0 < (int)uVar8) {
              uVar9 = 0;
              do {
                piVar3 = *(int **)(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar9 * 6 + 2);
                for (piVar7 = *(int **)(local_58.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + uVar9 * 6);
                    piVar7 != piVar3; piVar7 = piVar7 + 1) {
                  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar7] = (int)uVar9;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar8);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&local_58);
            piVar7 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          for (; piVar7 != local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
            *piVar7 = *piVar7 / ratio;
          }
        }
        else if (strategy == 2) {
          dVar12 = ceil((double)(int)uVar8 / (double)local_68);
          piVar4 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start !=
              local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            piVar10 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              dVar6 = div(*piVar10,(int)dVar12);
              *piVar10 = dVar6.rem;
              piVar10 = piVar10 + 1;
            } while (piVar10 != piVar4);
          }
        }
        else {
          piVar7 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (strategy == 1) {
            for (; piVar7 != local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
              *piVar7 = *piVar7 / ratio;
            }
          }
        }
        dm = local_60;
        if (*(int *)(DAT_00816950 + -0x48) == ParallelDescriptor::m_comm) {
          DistributionMapping::define
                    ((local_60->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ).
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11,
                     (Vector<int,_std::allocator<int>_> *)&local_80);
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_58,
                     (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2,&local_81);
          dm = local_60;
          ParallelContext::Frame::local_to_global_rank
                    ((Frame *)(DAT_00816950 + -0x48),
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)(int)((ulong)((long)local_80.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_80.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2));
          DistributionMapping::define
                    ((dm->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ).
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11,
                     (Vector<int,_std::allocator<int>_> *)&local_58);
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (int *)0x0) {
            operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        uVar9 = local_38;
        strategy = local_64;
        if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          uVar9 = local_38;
          strategy = local_64;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar9);
  }
  return;
}

Assistant:

void
MLLinOp::makeConsolidatedDMap (const Vector<BoxArray>& ba, Vector<DistributionMapping>& dm,
                               int ratio, int strategy)
{
    BL_PROFILE("MLLinOp::makeConsolidatedDMap()");

    int factor = 1;
    BL_ASSERT(!dm[0].empty());
    for (int i = 1, N=ba.size(); i < N; ++i)
    {
        if (dm[i].empty())
        {
            factor *= ratio;

            const int nprocs = ParallelContext::NProcsSub();
            const auto& pmap_fine = dm[i-1].ProcessorMap();
            Vector<int> pmap(pmap_fine.size());
            ParallelContext::global_to_local_rank(pmap.data(), pmap_fine.data(), pmap.size());
            if (strategy == 1) {
                for (auto& x: pmap) {
                    x /= ratio;
                }
            } else if (strategy == 2) {
                int nprocs_con = static_cast<int>(std::ceil(static_cast<Real>(nprocs)
                                                            / static_cast<Real>(factor)));
                for (auto& x: pmap) {
                    auto d = std::div(x,nprocs_con);
                    x = d.rem;
                }
            } else if (strategy == 3) {
                if (factor == ratio) {
                    const std::vector< std::vector<int> >& sfc = DistributionMapping::makeSFC(ba[i]);
                    for (int iproc = 0; iproc < nprocs; ++iproc) {
                        for (int ibox : sfc[iproc]) {
                            pmap[ibox] = iproc;
                        }
                    }
                }
                for (auto& x: pmap) {
                    x /= ratio;
                }
            }

            if (ParallelContext::CommunicatorSub() == ParallelDescriptor::Communicator()) {
                dm[i].define(std::move(pmap));
            } else {
                Vector<int> pmap_g(pmap.size());
                ParallelContext::local_to_global_rank(pmap_g.data(), pmap.data(), pmap.size());
                dm[i].define(std::move(pmap_g));
            }
        }
    }
}